

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgTypes.cpp
# Opt level: O1

void GetMinMax(dgBigVector *minOut,dgBigVector *maxOut,HaF64 *vertexArray,HaI32 vCount,
              HaI32 strideInBytes)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  HaF64 *pHVar10;
  int iVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  iVar11 = strideInBytes >> 3;
  if (iVar11 < 3) {
    __assert_fail("stride >= 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgTypes.cpp"
                  ,0x38,
                  "void GetMinMax(dgBigVector &, dgBigVector &, const hacd::HaF64 *const, hacd::HaI32, hacd::HaI32)"
                 );
  }
  dVar1 = (double)vertexArray[1];
  dVar2 = (double)vertexArray[2];
  if ((((!NAN(dVar2)) && ((ulong)ABS(dVar2) < 0x7ff0000000000000)) && (!NAN(dVar1))) &&
     (((ulong)ABS((double)*vertexArray) < 0x7ff0000000000000 &&
      ((ulong)ABS(dVar1) < 0x7ff0000000000000)))) {
    (minOut->super_dgTemplateVector<double>).m_x = (double)*vertexArray;
    (minOut->super_dgTemplateVector<double>).m_y = dVar1;
    (minOut->super_dgTemplateVector<double>).m_z = dVar2;
    (minOut->super_dgTemplateVector<double>).m_w = 0.0;
    dVar1 = (double)vertexArray[1];
    dVar2 = (double)vertexArray[2];
    if ((((!NAN(dVar2)) && (((ulong)ABS(dVar2) < 0x7ff0000000000000 && (!NAN(dVar1))))) &&
        ((ulong)ABS((double)*vertexArray) < 0x7ff0000000000000)) &&
       ((ulong)ABS(dVar1) < 0x7ff0000000000000)) {
      (maxOut->super_dgTemplateVector<double>).m_x = (double)*vertexArray;
      (maxOut->super_dgTemplateVector<double>).m_y = dVar1;
      (maxOut->super_dgTemplateVector<double>).m_z = dVar2;
      (maxOut->super_dgTemplateVector<double>).m_w = 0.0;
      if (1 < vCount) {
        iVar9 = vCount + -1;
        pHVar10 = vertexArray + (long)iVar11 + 2;
        do {
          auVar12._8_8_ = 0;
          auVar12._0_8_ = pHVar10[-2];
          auVar3._8_8_ = 0;
          auVar3._0_8_ = (minOut->super_dgTemplateVector<double>).m_x;
          auVar3 = vminsd_avx(auVar12,auVar3);
          (minOut->super_dgTemplateVector<double>).m_x = auVar3._0_8_;
          auVar13._8_8_ = 0;
          auVar13._0_8_ = pHVar10[-1];
          auVar4._8_8_ = 0;
          auVar4._0_8_ = (minOut->super_dgTemplateVector<double>).m_y;
          auVar3 = vminsd_avx(auVar13,auVar4);
          (minOut->super_dgTemplateVector<double>).m_y = auVar3._0_8_;
          auVar14._8_8_ = 0;
          auVar14._0_8_ = *pHVar10;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = (minOut->super_dgTemplateVector<double>).m_z;
          auVar3 = vminsd_avx(auVar14,auVar5);
          (minOut->super_dgTemplateVector<double>).m_z = auVar3._0_8_;
          auVar15._8_8_ = 0;
          auVar15._0_8_ = pHVar10[-2];
          auVar6._8_8_ = 0;
          auVar6._0_8_ = (maxOut->super_dgTemplateVector<double>).m_x;
          auVar3 = vmaxsd_avx(auVar15,auVar6);
          (maxOut->super_dgTemplateVector<double>).m_x = auVar3._0_8_;
          auVar16._8_8_ = 0;
          auVar16._0_8_ = pHVar10[-1];
          auVar7._8_8_ = 0;
          auVar7._0_8_ = (maxOut->super_dgTemplateVector<double>).m_y;
          auVar3 = vmaxsd_avx(auVar16,auVar7);
          (maxOut->super_dgTemplateVector<double>).m_y = auVar3._0_8_;
          auVar17._8_8_ = 0;
          auVar17._0_8_ = *pHVar10;
          auVar8._8_8_ = 0;
          auVar8._0_8_ = (maxOut->super_dgTemplateVector<double>).m_z;
          auVar3 = vmaxsd_avx(auVar17,auVar8);
          (maxOut->super_dgTemplateVector<double>).m_z = auVar3._0_8_;
          pHVar10 = pHVar10 + iVar11;
          iVar9 = iVar9 + -1;
        } while (iVar9 != 0);
      }
      return;
    }
  }
  __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                ,0x159,
                "dgBigVector::dgBigVector(hacd::HaF64, hacd::HaF64, hacd::HaF64, hacd::HaF64)");
}

Assistant:

void GetMinMax (dgBigVector &minOut, dgBigVector &maxOut, const hacd::HaF64* const vertexArray, hacd::HaI32 vCount, hacd::HaI32 strideInBytes)
{
	hacd::HaI32 stride = hacd::HaI32 (strideInBytes / sizeof (hacd::HaF64));
	const hacd::HaF64* vArray = vertexArray + stride;

	HACD_ASSERT (stride >= 3);
	minOut = dgBigVector (vertexArray[0], vertexArray[1], vertexArray[2], hacd::HaF64 (0.0f)); 
	maxOut = dgBigVector (vertexArray[0], vertexArray[1], vertexArray[2], hacd::HaF64 (0.0f)); 

	for (hacd::HaI32 i = 1; i < vCount; i ++) {
		minOut.m_x = GetMin (minOut.m_x, vArray[0]);
		minOut.m_y = GetMin (minOut.m_y, vArray[1]);
		minOut.m_z = GetMin (minOut.m_z, vArray[2]);

		maxOut.m_x = GetMax (maxOut.m_x, vArray[0]);
		maxOut.m_y = GetMax (maxOut.m_y, vArray[1]);
		maxOut.m_z = GetMax (maxOut.m_z, vArray[2]);

		vArray += stride;
	}
}